

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

void __thiscall helics::CommonCore::dataLink(CommonCore *this,string_view source,string_view target)

{
  size_t size;
  ActionMessage link;
  ActionMessage AStack_e8;
  
  size = source._M_len;
  ActionMessage::ActionMessage(&AStack_e8,cmd_data_link);
  AStack_e8.payload.bufferSize = size;
  if ((AStack_e8.payload.heap != (byte *)source._M_str) &&
     (SmallBuffer::reserve(&AStack_e8.payload,size), size != 0)) {
    memcpy(AStack_e8.payload.heap,source._M_str,size);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&AStack_e8.stringData,1);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (AStack_e8.stringData.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,0,
             (AStack_e8.stringData.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->_M_string_length,target._M_str,
             target._M_len);
  BrokerBase::addActionMessage(&this->super_BrokerBase,&AStack_e8);
  ActionMessage::~ActionMessage(&AStack_e8);
  return;
}

Assistant:

void CommonCore::dataLink(std::string_view source, std::string_view target)
{
    ActionMessage link(CMD_DATA_LINK);
    link.name(source);
    link.setStringData(target);
    addActionMessage(std::move(link));
}